

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_aaace::anon_func::OptimizeForJS::~OptimizeForJS(OptimizeForJS *this)

{
  ::wasm::WalkerPass<wasm::PostWalker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_>_>::
  ~WalkerPass(&this->
               super_WalkerPass<wasm::PostWalker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_>_>
             );
  operator_delete(this,0x108);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }